

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_sad_sse4.c
# Opt level: O1

uint aom_obmc_sad4x16_sse4_1(uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *msk)

{
  int *piVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar4 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  uVar2 = 0xfffffffffffffffc;
  auVar4 = pmovsxwd(in_XMM1,0x800080008000800);
  auVar3 = (undefined1  [16])0x0;
  do {
    auVar5 = pmovzxbd(in_XMM2,*(undefined4 *)pre);
    piVar1 = wsrc + uVar2 + 4;
    auVar5 = pmaddwd(auVar5,*(undefined1 (*) [16])(msk + uVar2 + 4));
    auVar6._0_4_ = *piVar1 - auVar5._0_4_;
    auVar6._4_4_ = piVar1[1] - auVar5._4_4_;
    auVar6._8_4_ = piVar1[2] - auVar5._8_4_;
    auVar6._12_4_ = piVar1[3] - auVar5._12_4_;
    auVar5 = pabsd(auVar5,auVar6);
    in_XMM2._0_4_ = (uint)(auVar5._0_4_ + auVar4._0_4_) >> 0xc;
    in_XMM2._4_4_ = (uint)(auVar5._4_4_ + auVar4._4_4_) >> 0xc;
    in_XMM2._8_4_ = (uint)(auVar5._8_4_ + auVar4._8_4_) >> 0xc;
    in_XMM2._12_4_ = (uint)(auVar5._12_4_ + auVar4._12_4_) >> 0xc;
    auVar5._0_4_ = auVar3._0_4_ + in_XMM2._0_4_;
    auVar5._4_4_ = auVar3._4_4_ + in_XMM2._4_4_;
    auVar5._8_4_ = auVar3._8_4_ + in_XMM2._8_4_;
    auVar5._12_4_ = auVar3._12_4_ + in_XMM2._12_4_;
    uVar2 = uVar2 + 4;
    pre = pre + (long)(pre_stride + -4) + 4;
    auVar3 = auVar5;
  } while (uVar2 < 0x3c);
  auVar3 = phaddd(auVar5,auVar5);
  auVar3 = phaddd(auVar3,auVar3);
  return auVar3._0_4_;
}

Assistant:

static AOM_FORCE_INLINE unsigned int obmc_sad_w4(const uint8_t *pre,
                                                 const int pre_stride,
                                                 const int32_t *wsrc,
                                                 const int32_t *mask,
                                                 const int height) {
  const int pre_step = pre_stride - 4;
  int n = 0;
  __m128i v_sad_d = _mm_setzero_si128();

  do {
    const __m128i v_p_b = xx_loadl_32(pre + n);
    const __m128i v_m_d = xx_load_128(mask + n);
    const __m128i v_w_d = xx_load_128(wsrc + n);

    const __m128i v_p_d = _mm_cvtepu8_epi32(v_p_b);

    // Values in both pre and mask fit in 15 bits, and are packed at 32 bit
    // boundaries. We use pmaddwd, as it has lower latency on Haswell
    // than pmulld but produces the same result with these inputs.
    const __m128i v_pm_d = _mm_madd_epi16(v_p_d, v_m_d);

    const __m128i v_diff_d = _mm_sub_epi32(v_w_d, v_pm_d);
    const __m128i v_absdiff_d = _mm_abs_epi32(v_diff_d);

    // Rounded absolute difference
    const __m128i v_rad_d = xx_roundn_epu32(v_absdiff_d, 12);

    v_sad_d = _mm_add_epi32(v_sad_d, v_rad_d);

    n += 4;

    if (n % 4 == 0) pre += pre_step;
  } while (n < 4 * height);

  return xx_hsum_epi32_si32(v_sad_d);
}